

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsMessageSetTime(HelicsMessage message,HelicsTime time,HelicsError *err)

{
  long lVar1;
  
  if (err == (HelicsError *)0x0) {
    if ((message != (HelicsMessage)0x0) && (*(short *)((long)message + 10) == 0xb3))
    goto LAB_001ab573;
  }
  else if (err->error_code == 0) {
    if ((message == (HelicsMessage)0x0) || (*(short *)((long)message + 10) != 0xb3)) {
      err->error_code = -4;
      err->message = "The message object was not valid";
      return;
    }
LAB_001ab573:
    lVar1 = 0x7fffffffffffffff;
    if (time <= -9223372036.854765) {
      lVar1 = -0x7fffffffffffffff;
    }
    else if (time < 9223372036.854765) {
      lVar1 = (long)(time * 1000000000.0 +
                    *(double *)(&DAT_00429020 + (ulong)(0.0 <= time * 1000000000.0) * 8));
    }
    *(long *)message = lVar1;
    return;
  }
  return;
}

Assistant:

helics::Message* getMessageObj(HelicsMessage message, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    auto* mess = reinterpret_cast<helics::Message*>(message);
    if (mess == nullptr || mess->messageValidation != messageKeyCode) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidMessageObject);
        return nullptr;
    }
    return mess;
}